

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
::rebalance_left_to_right
          (btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
           *this,int to_move,
          btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
          *right,allocator_type *alloc)

{
  slot_type *psVar1;
  allocator_type *paVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  field_type fVar6;
  int iVar7;
  btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
  *pbVar8;
  btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
  *pbVar9;
  long n;
  slot_type *psVar10;
  slot_type *psVar11;
  slot_type *psVar12;
  int local_58;
  uint local_54;
  int i_1;
  int i;
  size_type uninitialized_remaining;
  slot_type *local_40;
  slot_type *end;
  slot_type *dest;
  slot_type *src;
  allocator_type *alloc_local;
  btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
  *right_local;
  btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
  *pbStack_10;
  int to_move_local;
  btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
  *this_local;
  
  src = (slot_type *)alloc;
  alloc_local = (allocator_type *)right;
  right_local._4_4_ = to_move;
  pbStack_10 = this;
  pbVar8 = parent(this);
  pbVar9 = parent((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                   *)alloc_local);
  if (pbVar8 != pbVar9) {
    __assert_fail("parent() == right->parent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x627,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>]"
                 );
  }
  bVar3 = position(this);
  bVar4 = position((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                    *)alloc_local);
  if (bVar3 + 1 != (uint)bVar4) {
    __assert_fail("position() + 1 == right->position()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x628,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>]"
                 );
  }
  bVar3 = count(this);
  bVar4 = count((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                 *)alloc_local);
  iVar7 = right_local._4_4_;
  if (bVar3 < bVar4) {
    __assert_fail("count() >= right->count()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x629,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>]"
                 );
  }
  if (right_local._4_4_ < 1) {
    __assert_fail("to_move >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x62a,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>]"
                 );
  }
  bVar3 = count(this);
  if ((int)(uint)bVar3 < iVar7) {
    __assert_fail("to_move <= count()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x62b,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>]"
                 );
  }
  bVar3 = count((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                 *)alloc_local);
  paVar2 = alloc_local;
  if ((int)(uint)bVar3 < right_local._4_4_) {
    bVar3 = count((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                   *)alloc_local);
    uninitialized_move_n
              ((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                *)paVar2,(ulong)bVar3,0,(long)right_local._4_4_,
               (btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                *)alloc_local,(allocator_type *)src);
    paVar2 = alloc_local;
    psVar1 = src;
    iVar7 = right_local._4_4_ + -1;
    pbVar8 = parent(this);
    bVar3 = position(this);
    uninitialized_remaining = (size_type)slot(pbVar8,(uint)bVar3);
    btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,256,false>>
    ::
    value_init<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,256,false>::slot_type*>
              ((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,256,false>>
                *)paVar2,(long)iVar7,(allocator_type *)psVar1,(slot_type **)&uninitialized_remaining
              );
    iVar7 = right_local._4_4_;
    bVar3 = count((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                   *)alloc_local);
    iVar7 = (iVar7 - (uint)bVar3) + -1;
    bVar3 = count(this);
    bVar4 = count((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                   *)alloc_local);
    uninitialized_move_n
              (this,(long)iVar7,(ulong)bVar3 - (long)iVar7,(ulong)bVar4,
               (btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                *)alloc_local,(allocator_type *)src);
    psVar1 = src;
    bVar3 = count(this);
    psVar10 = slot(this,(uint)bVar3 - (right_local._4_4_ + -1));
    bVar3 = count(this);
    psVar11 = slot(this,(uint)bVar3 - iVar7);
    psVar12 = slot((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                    *)alloc_local,0);
    set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>
    ::slot_type::move((allocator<S2ClosestCellQueryBase<S2MinDistance>::Result> *)psVar1,psVar10,
                      psVar11,psVar12);
  }
  else {
    n = (long)right_local._4_4_;
    bVar3 = count((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                   *)alloc_local);
    iVar7 = (uint)bVar3 - right_local._4_4_;
    bVar3 = count((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                   *)alloc_local);
    uninitialized_move_n
              ((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                *)paVar2,n,(long)iVar7,(ulong)bVar3,
               (btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                *)alloc_local,(allocator_type *)src);
    paVar2 = alloc_local;
    bVar3 = count((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                   *)alloc_local);
    dest = slot((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                 *)paVar2,((uint)bVar3 - right_local._4_4_) + -1);
    paVar2 = alloc_local;
    bVar3 = count((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                   *)alloc_local);
    end = slot((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                *)paVar2,bVar3 - 1);
    local_40 = slot((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                     *)alloc_local,0);
    for (; psVar1 = src, local_40 <= dest; dest = dest + -1) {
      set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>
      ::slot_type::move((allocator<S2ClosestCellQueryBase<S2MinDistance>::Result> *)src,dest,end);
      end = end + -1;
    }
    pbVar8 = parent(this);
    bVar3 = position(this);
    psVar10 = slot(pbVar8,(uint)bVar3);
    psVar11 = slot((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                    *)alloc_local,right_local._4_4_ + -1);
    set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>
    ::slot_type::move((allocator<S2ClosestCellQueryBase<S2MinDistance>::Result> *)psVar1,psVar10,
                      psVar11);
    psVar1 = src;
    bVar3 = count(this);
    psVar10 = slot(this,(uint)bVar3 - (right_local._4_4_ + -1));
    bVar3 = count(this);
    psVar11 = slot(this,(uint)bVar3);
    psVar12 = slot((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                    *)alloc_local,0);
    set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>
    ::slot_type::move((allocator<S2ClosestCellQueryBase<S2MinDistance>::Result> *)psVar1,psVar10,
                      psVar11,psVar12);
  }
  psVar1 = src;
  bVar3 = count(this);
  psVar10 = slot(this,(uint)bVar3 - right_local._4_4_);
  pbVar8 = parent(this);
  bVar3 = position(this);
  psVar11 = slot(pbVar8,(uint)bVar3);
  set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>
  ::slot_type::move((allocator<S2ClosestCellQueryBase<S2MinDistance>::Result> *)psVar1,psVar10,
                    psVar11);
  bVar3 = count(this);
  value_destroy_n(this,(long)(int)((uint)bVar3 - right_local._4_4_),(long)right_local._4_4_,
                  (allocator_type *)src);
  bVar5 = leaf(this);
  if (!bVar5) {
    bVar3 = count((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                   *)alloc_local);
    for (local_54 = (uint)bVar3; paVar2 = alloc_local, -1 < (int)local_54; local_54 = local_54 - 1)
    {
      iVar7 = local_54 + right_local._4_4_;
      pbVar8 = child((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                      *)alloc_local,local_54);
      init_child((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                  *)paVar2,iVar7,pbVar8);
      clear_child((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                   *)alloc_local,local_54);
    }
    for (local_58 = 1; paVar2 = alloc_local, local_58 <= right_local._4_4_; local_58 = local_58 + 1)
    {
      bVar3 = count(this);
      pbVar8 = child(this,((uint)bVar3 - right_local._4_4_) + local_58);
      init_child((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                  *)paVar2,local_58 + -1,pbVar8);
      bVar3 = count(this);
      clear_child(this,((uint)bVar3 - right_local._4_4_) + local_58);
    }
  }
  fVar6 = count(this);
  set_count(this,fVar6 - (char)right_local._4_4_);
  paVar2 = alloc_local;
  fVar6 = count((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
                 *)alloc_local);
  set_count((btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
             *)paVar2,fVar6 + (char)right_local._4_4_);
  return;
}

Assistant:

void btree_node<P>::rebalance_left_to_right(const int to_move,
                                            btree_node *right,
                                            allocator_type *alloc) {
  assert(parent() == right->parent());
  assert(position() + 1 == right->position());
  assert(count() >= right->count());
  assert(to_move >= 1);
  assert(to_move <= count());

  // Values in the right node are shifted to the right to make room for the
  // new to_move values. Then, the delimiting value in the parent and the
  // other (to_move - 1) values in the left node are moved into the right node.
  // Lastly, a new delimiting value is moved from the left node into the
  // parent, and the remaining empty left node entries are destroyed.

  if (right->count() >= to_move) {
    // The original location of the right->count() values are sufficient to hold
    // the new to_move entries from the parent and left node.

    // 1) Shift existing values in the right node to their correct positions.
    right->uninitialized_move_n(to_move, right->count() - to_move,
                                right->count(), right, alloc);
    for (slot_type *src = right->slot(right->count() - to_move - 1),
                   *dest = right->slot(right->count() - 1),
                   *end = right->slot(0);
         src >= end; --src, --dest) {
      slot_type::move(alloc, src, dest);
    }

    // 2) Move the delimiting value in the parent to the right node.
    slot_type::move(alloc, parent()->slot(position()),
                    right->slot(to_move - 1));

    // 3) Move the (to_move - 1) values from the left node to the right node.
    slot_type::move(alloc, slot(count() - (to_move - 1)), slot(count()),
                    right->slot(0));
  } else {
    // The right node does not have enough initialized space to hold the new
    // to_move entries, so part of them will move to uninitialized space.

    // 1) Shift existing values in the right node to their correct positions.
    right->uninitialized_move_n(right->count(), 0, to_move, right, alloc);

    // 2) Move the delimiting value in the parent to the right node.
    right->value_init(to_move - 1, alloc, parent()->slot(position()));

    // 3) Move the (to_move - 1) values from the left node to the right node.
    const size_type uninitialized_remaining = to_move - right->count() - 1;
    uninitialized_move_n(uninitialized_remaining,
                         count() - uninitialized_remaining, right->count(),
                         right, alloc);
    slot_type::move(alloc, slot(count() - (to_move - 1)),
                    slot(count() - uninitialized_remaining), right->slot(0));
  }

  // 4) Move the new delimiting value to the parent from the left node.
  slot_type::move(alloc, slot(count() - to_move), parent()->slot(position()));

  // 5) Destroy the now-empty to_move entries in the left node.
  value_destroy_n(count() - to_move, to_move, alloc);

  if (!leaf()) {
    // Move the child pointers from the left to the right node.
    for (int i = right->count(); i >= 0; --i) {
      right->init_child(i + to_move, right->child(i));
      right->clear_child(i);
    }
    for (int i = 1; i <= to_move; ++i) {
      right->init_child(i - 1, child(count() - to_move + i));
      clear_child(count() - to_move + i);
    }
  }

  // Fixup the counts on the left and right nodes.
  set_count(count() - to_move);
  right->set_count(right->count() + to_move);
}